

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::SliderCalcRatioFromValueT<unsigned_long_long,double>
                (ImGuiDataType data_type,unsigned_long_long v,unsigned_long_long v_min,
                unsigned_long_long v_max,float power,float linear_zero_pos)

{
  long lVar1;
  long lVar2;
  ulong in_RCX;
  unsigned_long_long in_RDX;
  unsigned_long_long in_RSI;
  int in_EDI;
  float in_XMM0_Da;
  float fVar3;
  undefined1 auVar4 [16];
  float in_XMM1_Da;
  undefined1 auVar5 [16];
  float f_1;
  float f;
  unsigned_long_long v_clamped;
  bool is_power;
  float local_54;
  ulong local_50;
  bool local_42;
  float local_4;
  
  if (in_RDX == in_RCX) {
    local_4 = 0.0;
  }
  else {
    local_42 = false;
    if ((in_XMM0_Da != 1.0) || (NAN(in_XMM0_Da))) {
      local_42 = in_EDI == 8 || in_EDI == 9;
    }
    if (in_RDX < in_RCX) {
      local_50 = ImClamp<unsigned_long_long>(in_RSI,in_RDX,in_RCX);
    }
    else {
      local_50 = ImClamp<unsigned_long_long>(in_RSI,in_RCX,in_RDX);
    }
    if (local_42) {
      local_54 = (float)local_50;
      if (0.0 <= local_54) {
        ImMax<unsigned_long_long>(0,in_RDX);
        ImMax<unsigned_long_long>(0,in_RDX);
        fVar3 = ImPow(0.0,3.211587e-39);
        local_4 = fVar3 * (1.0 - in_XMM1_Da) + in_XMM1_Da;
      }
      else {
        ImMin<unsigned_long_long>(0,in_RCX);
        fVar3 = ImPow(0.0,3.211232e-39);
        local_4 = (1.0 - fVar3) * in_XMM1_Da;
      }
    }
    else {
      lVar1 = local_50 - in_RDX;
      auVar4._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar4._0_8_ = lVar1;
      auVar4._12_4_ = 0x45300000;
      lVar2 = in_RCX - in_RDX;
      auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar5._0_8_ = lVar2;
      auVar5._12_4_ = 0x45300000;
      local_4 = (float)(((auVar4._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) /
                       ((auVar5._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)));
    }
  }
  return local_4;
}

Assistant:

float ImGui::SliderCalcRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, float power, float linear_zero_pos)
{
    if (v_min == v_max)
        return 0.0f;

    const bool is_power = (power != 1.0f) && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_power)
    {
        if (v_clamped < 0.0f)
        {
            const float f = 1.0f - (float)((v_clamped - v_min) / (ImMin((TYPE)0, v_max) - v_min));
            return (1.0f - ImPow(f, 1.0f/power)) * linear_zero_pos;
        }
        else
        {
            const float f = (float)((v_clamped - ImMax((TYPE)0, v_min)) / (v_max - ImMax((TYPE)0, v_min)));
            return linear_zero_pos + ImPow(f, 1.0f/power) * (1.0f - linear_zero_pos);
        }
    }

    // Linear slider
    return (float)((FLOATTYPE)(v_clamped - v_min) / (FLOATTYPE)(v_max - v_min));
}